

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Action_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::IO_Action_PDU::Decode(IO_Action_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  ushort uVar3;
  allocator<char> local_49;
  KString local_48;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x37 < iVar2 + (uint)KVar1) {
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
    ::clear(&this->m_vStdVarRecs);
    IO_Header::Decode(&this->super_IO_Header,stream,ignoreHeader);
    (*(this->m_RecEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_RecEntityID,stream);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32ReqId);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16WrTyp);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16SimSrc);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16ActTyp);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16ActPhs);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding);
    (*(this->m_AtkEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_AtkEntityID,stream);
    (*(this->m_TgtEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_TgtEntityID,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumStdVarRec);
    for (uVar3 = 0; uVar3 < this->m_ui16NumStdVarRec; uVar3 = uVar3 + 1) {
      DATA_TYPE::StandardVariable::FactoryDecodeStandardVariable((StdVarPtr *)&local_48,stream);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
                  *)&this->m_vStdVarRecs,(KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_48);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::~KRef_Ptr
                ((KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_48);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Decode",&local_49);
  KException::KException(this_00,&local_48,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void IO_Action_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < IO_ACTION_PDU_SIZE  )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vStdVarRecs.clear();

    IO_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_RecEntityID
           >> m_ui32ReqId
           >> m_ui16WrTyp
           >> m_ui16SimSrc
           >> m_ui16ActTyp
           >> m_ui16ActPhs
           >> m_ui32Padding
           >> KDIS_STREAM m_AtkEntityID
           >> KDIS_STREAM m_TgtEntityID
           >> m_ui16Padding
           >> m_ui16NumStdVarRec;

    // Use the factory decode function for each standard variable
    for( KUINT16 i = 0; i < m_ui16NumStdVarRec; ++i )
    {
        m_vStdVarRecs.push_back( StandardVariable::FactoryDecodeStandardVariable( stream ) );
    }
}